

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::resize_bilinear_c4
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  float fVar5;
  int iVar6;
  short *rows0_old;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  int dx;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int dx_1;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  short *local_120;
  Mat rowsbuf0;
  Mat rowsbuf1;
  
  uVar20 = (h + w) * 2;
  uVar18 = 0xffffffffffffffff;
  if (-1 < (int)uVar20) {
    uVar18 = (ulong)uVar20 * 4;
  }
  pvVar7 = operator_new__(uVar18);
  lVar10 = (long)w;
  uVar18 = 0;
  if (0 < w) {
    uVar18 = (ulong)(uint)w;
  }
  lVar1 = (long)h * 4 + lVar10 * 4;
  for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    fVar5 = ((float)(int)uVar17 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
    fVar22 = floorf(fVar5);
    iVar6 = (int)fVar22;
    fVar25 = 0.0;
    bVar19 = -1 < iVar6;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (bVar19) {
      fVar25 = (fVar5 - (float)(int)fVar22) * 2048.0;
    }
    if (srcw + -1 <= iVar6) {
      fVar25 = 2048.0;
      iVar6 = srcw + -2;
    }
    *(int *)((long)pvVar7 + uVar17 * 4) = iVar6 << 2;
    uVar20 = -(uint)(0.0 <= 2048.0 - fVar25);
    auVar23._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar25));
    auVar23._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000) +
              fVar25);
    auVar23._8_8_ = 0;
    auVar23 = packssdw(auVar23,auVar23);
    *(int *)((long)pvVar7 + uVar17 * 4 + lVar1) = auVar23._0_4_;
  }
  uVar20 = h;
  if (h < 1) {
    uVar20 = 0;
  }
  local_120 = (short *)((long)pvVar7 + (long)h * 4 + lVar10 * 8);
  for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
    fVar5 = ((float)(int)uVar17 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
    fVar22 = floorf(fVar5);
    iVar6 = (int)fVar22;
    fVar25 = 0.0;
    bVar19 = -1 < iVar6;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (bVar19) {
      fVar25 = (fVar5 - (float)(int)fVar22) * 2048.0;
    }
    iVar14 = iVar6;
    if (srch + -1 <= iVar6) {
      iVar14 = srch + -2;
    }
    *(int *)((long)pvVar7 + uVar17 * 4 + lVar10 * 4) = iVar14;
    if (srch + -1 <= iVar6) {
      fVar25 = 2048.0;
    }
    uVar21 = -(uint)(0.0 <= 2048.0 - fVar25);
    auVar24._0_4_ = (int)((float)(uVar21 & 0x3f000000 | ~uVar21 & 0xbf000000) + (2048.0 - fVar25));
    auVar24._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000) +
              fVar25);
    auVar24._8_8_ = 0;
    auVar23 = packssdw(auVar24,auVar24);
    *(int *)(local_120 + uVar17 * 2) = auVar23._0_4_;
  }
  iVar14 = w << 2;
  Mat::Mat(&rowsbuf0,iVar14,2,(Allocator *)0x0);
  Mat::Mat(&rowsbuf1,iVar14,2,(Allocator *)0x0);
  iVar6 = -2;
  for (uVar17 = 0; uVar17 != uVar20; uVar17 = uVar17 + 1) {
    iVar4 = *(int *)((long)pvVar7 + uVar17 * 4 + lVar10 * 4);
    pvVar8 = rowsbuf0.data;
    pvVar9 = rowsbuf1.data;
    if (iVar4 != iVar6) {
      if (iVar4 == iVar6 + 4) {
        iVar6 = (iVar4 + 1) * srcstride;
        for (uVar12 = 0; pvVar8 = rowsbuf1.data, pvVar9 = rowsbuf0.data, uVar18 != uVar12;
            uVar12 = uVar12 + 1) {
          lVar13 = (long)*(int *)((long)pvVar7 + uVar12 * 4);
          iVar15 = (int)*(short *)((long)pvVar7 + uVar12 * 4 + lVar1);
          iVar11 = (int)*(short *)((long)pvVar7 + uVar12 * 4 + lVar1 + 2);
          *(short *)((long)rowsbuf0.data + uVar12 * 8) =
               (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar11 +
                       (uint)src[lVar13 + iVar6] * iVar15 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 2) =
               (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar11 +
                       (uint)src[lVar13 + (long)iVar6 + 1] * iVar15 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 4) =
               (short)((uint)src[lVar13 + (long)iVar6 + 6] * iVar11 +
                       (uint)src[lVar13 + (long)iVar6 + 2] * iVar15 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 6) =
               (short)((uint)src[lVar13 + (long)iVar6 + 7] * iVar11 +
                       (uint)src[lVar13 + (long)iVar6 + 3] * iVar15 >> 4);
        }
      }
      else {
        iVar6 = iVar4 * srcstride;
        iVar11 = (iVar4 + 1) * srcstride;
        for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
          lVar13 = (long)*(int *)((long)pvVar7 + uVar12 * 4);
          iVar16 = (int)*(short *)((long)pvVar7 + uVar12 * 4 + lVar1);
          iVar15 = (int)*(short *)((long)pvVar7 + uVar12 * 4 + lVar1 + 2);
          *(short *)((long)rowsbuf0.data + uVar12 * 8) =
               (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar15 +
                       (uint)src[lVar13 + iVar6] * iVar16 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 2) =
               (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar15 +
                       (uint)src[lVar13 + (long)iVar6 + 1] * iVar16 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 4) =
               (short)((uint)src[lVar13 + (long)iVar6 + 6] * iVar15 +
                       (uint)src[lVar13 + (long)iVar6 + 2] * iVar16 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 8 + 6) =
               (short)((uint)src[lVar13 + (long)iVar6 + 7] * iVar15 +
                       (uint)src[lVar13 + (long)iVar6 + 3] * iVar16 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 8) =
               (short)((uint)src[lVar13 + (long)iVar11 + 4] * iVar15 +
                       (uint)src[lVar13 + iVar11] * iVar16 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 8 + 2) =
               (short)((uint)src[lVar13 + (long)iVar11 + 5] * iVar15 +
                       (uint)src[lVar13 + (long)iVar11 + 1] * iVar16 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 8 + 4) =
               (short)((uint)src[lVar13 + (long)iVar11 + 6] * iVar15 +
                       (uint)src[lVar13 + (long)iVar11 + 2] * iVar16 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 8 + 6) =
               (short)((uint)src[lVar13 + (long)iVar11 + 7] * iVar15 +
                       (uint)src[lVar13 + (long)iVar11 + 3] * iVar16 >> 4);
        }
      }
    }
    sVar2 = *local_120;
    sVar3 = local_120[1];
    for (lVar13 = 0; iVar14 != (int)lVar13; lVar13 = lVar13 + 1) {
      dst[lVar13] = (uchar)(((uint)((int)*(short *)((long)pvVar8 + lVar13 * 2) * (int)sVar2) >> 0x10
                            ) + ((uint)((int)*(short *)((long)pvVar9 + lVar13 * 2) * (int)sVar3) >>
                                0x10) + 2 >> 2);
    }
    local_120 = local_120 + 2;
    dst = dst + stride;
    rowsbuf0.data = pvVar8;
    rowsbuf1.data = pvVar9;
    iVar6 = iVar4;
  }
  operator_delete__(pvVar7);
  Mat::~Mat(&rowsbuf1);
  Mat::~Mat(&rowsbuf0);
  return;
}

Assistant:

void resize_bilinear_c4(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS=11;
    const int INTER_RESIZE_COEF_SCALE=1 << INTER_RESIZE_COEF_BITS;
//     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    short* ialpha = (short*)(buf + w + h);//new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w);//new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx*4;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 =        fx  * INTER_RESIZE_COEF_SCALE;

        ialpha[dx*2    ] = SATURATE_CAST_SHORT(a0);
        ialpha[dx*2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 =        fy  * INTER_RESIZE_COEF_SCALE;

        ibeta[dy*2    ] = SATURATE_CAST_SHORT(b0);
        ibeta[dy*2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w*4, (size_t)2u);
    Mat rowsbuf1(w*4, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 4)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0]*a0 + S1p[4]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[5]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[6]*a1) >> 4;
                rows1p[3] = (S1p[3]*a0 + S1p[7]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 4;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char *S0 = src + srcstride * (sy);
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = vld1_u8(S0p);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vget_high_s16(_S016);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0]*a0 + S0p[4]*a1) >> 4;
                rows0p[1] = (S0p[1]*a0 + S0p[5]*a1) >> 4;
                rows0p[2] = (S0p[2]*a0 + S0p[6]*a1) >> 4;
                rows0p[3] = (S0p[3]*a0 + S0p[7]*a1) >> 4;
                rows1p[0] = (S1p[0]*a0 + S1p[4]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[5]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[6]*a1) >> 4;
                rows1p[3] = (S1p[3]*a0 + S1p[7]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 4;
                rows1p += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 4) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 4) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn>0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p+4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p+4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "vdup.s16   d16, %8         \n"
            "mov        r4, #2          \n"
            "vdup.s16   d17, %9         \n"
            "vdup.s32   q12, r4         \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "0:                         \n"
            "vmull.s16  q0, d2, d16     \n"
            "vmull.s16  q1, d3, d16     \n"
            "vorr.s32   q10, q12, q12   \n"
            "vorr.s32   q11, q12, q12   \n"
            "vmull.s16  q2, d6, d17     \n"
            "vmull.s16  q3, d7, d17     \n"
            "vsra.s32   q10, q0, #16    \n"
            "vsra.s32   q11, q1, #16    \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "vsra.s32   q10, q2, #16    \n"
            "vsra.s32   q11, q3, #16    \n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "vshrn.s32  d20, q10, #2    \n"
            "vshrn.s32  d21, q11, #2    \n"
            "vqmovun.s16 d20, q10        \n"
            "vst1.8     {d20}, [%2]!    \n"
            "subs       %3, #1          \n"
            "bne        0b              \n"
            "sub        %0, #16         \n"
            "sub        %1, #16         \n"
            : "=r"(rows0p), // %0
              "=r"(rows1p), // %1
              "=r"(Dp),     // %2
              "=r"(nn)      // %3
            : "0"(rows0p),
              "1"(rows1p),
              "2"(Dp),
              "3"(nn),
              "r"(b0),      // %8
              "r"(b1)       // %9
            : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(( (short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2)>>2);
        }

        ibeta += 2;
    }

    delete[] buf;
}